

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::EasyHandle::EasyHandle(EasyHandle *this)

{
  handle_t pCVar1;
  ostream *poVar2;
  EasyHandle *this_local;
  
  pCVar1 = (handle_t)curl_easy_init();
  this->handle_ = pCVar1;
  poVar2 = std::operator<<((ostream *)&std::clog,"EasyHandle created: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->handle_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

EasyHandle() {
            RESTINCURL_LOG("EasyHandle created: " << handle_);
        }